

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O2

int Prs_CreateBlifNtk(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  Cba_Man_t *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Cba_ObjType_t CVar7;
  char *pStr;
  Cba_Ntk_t *pCVar8;
  int i;
  int iVar9;
  
  pCVar1 = p->pDesign;
  for (iVar9 = 0; iVar9 < (pCVar1->vUsed).nSize; iVar9 = iVar9 + 1) {
    iVar2 = Vec_IntEntry(&pCVar1->vUsed,iVar9);
    Vec_IntWriteEntry(&pCVar1->vNameMap,iVar2,0);
  }
  (pCVar1->vUsed).nSize = 0;
  for (iVar9 = 0; iVar9 < (p->vInputs).nSize; iVar9 = iVar9 + 1) {
    iVar2 = Vec_IntEntry(&p->vInputs,iVar9);
    iVar3 = Cba_ObjName(p,iVar2);
    iVar2 = Cba_ObjFon0(p,iVar2);
    Cba_NtkSetMap(p,iVar3,iVar2);
  }
  iVar9 = 0;
  do {
    iVar2 = (pNtk->vObjs).nSize;
    if (iVar2 <= iVar9) {
      iVar9 = 0;
      do {
        if (iVar2 <= iVar9) {
          for (iVar9 = 0; iVar9 < (p->vOutputs).nSize; iVar9 = iVar9 + 1) {
            iVar2 = Vec_IntEntry(&p->vOutputs,iVar9);
            iVar3 = Cba_ObjName(p,iVar2);
            iVar3 = Prs_CreateBlifFindFon(p,iVar3);
            if (iVar3 != 0) {
              Cba_ObjSetFinFon(p,iVar2,0,iVar3);
            }
          }
          return 0;
        }
        Prs_BoxSignals(pNtk,iVar9);
        iVar2 = (p->vOutputs).nSize;
        iVar5 = (p->vInputs).nSize + iVar9;
        iVar4 = iVar2 + iVar5 + 1;
        iVar3 = Prs_BoxNtk(pNtk,iVar9);
        if (iVar3 == -1) {
          CVar7 = Cba_ObjType(p,iVar4);
          if (CVar7 != CBA_BOX_DFFRS) {
            __assert_fail("Cba_ObjType(p, iObj) == CBA_BOX_DFFRS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                          ,0x21e,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          iVar2 = Vec_IntEntry(&Prs_BoxSignals::V,1);
          iVar2 = Prs_CreateBlifFindFon(p,iVar2);
          if (iVar2 != 0) {
            Cba_ObjSetFinFon(p,iVar4,0,iVar2);
          }
        }
        else {
          iVar3 = Prs_BoxIsNode(pNtk,iVar9);
          if (iVar3 == 0) {
            pCVar8 = Cba_ObjNtk(p,iVar4);
            iVar3 = (pCVar8->vInputs).nSize;
            iVar6 = Cba_ObjFinNum(p,iVar4);
            if (iVar3 != iVar6) {
              __assert_fail("Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                            ,0x233,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            iVar5 = iVar5 + iVar2;
            if (iVar5 < 0) {
              __assert_fail("i>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xec,"int Cba_ObjFonNum(Cba_Ntk_t *, int)");
            }
            iVar2 = (pCVar8->vOutputs).nSize;
            iVar3 = Cba_ObjFon0(p,iVar5 + 2);
            iVar5 = Cba_ObjFon0(p,iVar4);
            if (iVar2 != iVar3 - iVar5) {
              __assert_fail("Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                            ,0x234,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            Cba_NtkCleanMap2(p);
            iVar2 = 0;
            while (iVar2 < (pCVar8->vInputs).nSize) {
              iVar3 = Vec_IntEntry(&pCVar8->vInputs,iVar2);
              iVar3 = Cba_ObjName(pCVar8,iVar3);
              iVar2 = iVar2 + 1;
              Cba_NtkSetMap2(p,iVar3,iVar2);
            }
            for (iVar2 = 1; iVar2 < Prs_BoxSignals::V.nSize; iVar2 = iVar2 + 2) {
              iVar3 = Vec_IntEntry(&Prs_BoxSignals::V,iVar2 + -1);
              iVar5 = Vec_IntEntry(&Prs_BoxSignals::V,iVar2);
              iVar6 = Cba_NtkGetMap2(p,iVar3);
              if (iVar6 != 0) {
                iVar5 = Prs_CreateBlifFindFon(p,iVar5);
                if (iVar5 != 0) {
                  iVar3 = Cba_NtkGetMap2(p,iVar3);
                  Cba_ObjSetFinFon(p,iVar4,iVar3 + -1,iVar5);
                }
              }
            }
          }
          else {
            CVar7 = Cba_ObjType(p,iVar4);
            if (CVar7 != CBA_BOX_NODE) {
              __assert_fail("Cba_ObjType(p, iObj) == CBA_BOX_NODE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                            ,0x225,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            iVar2 = 0;
            for (iVar3 = 1; iVar3 < Prs_BoxSignals::V.nSize; iVar3 = iVar3 + 2) {
              Vec_IntEntry(&Prs_BoxSignals::V,iVar3 + -1);
              iVar5 = Vec_IntEntry(&Prs_BoxSignals::V,iVar3);
              iVar6 = Cba_ObjFinNum(p,iVar4);
              if (iVar3 + -1 == iVar6 * 2) break;
              iVar5 = Prs_CreateBlifFindFon(p,iVar5);
              if (iVar5 != 0) {
                Cba_ObjSetFinFon(p,iVar4,iVar2,iVar5);
              }
              iVar2 = iVar2 + 1;
            }
          }
        }
        iVar9 = iVar9 + 1;
        iVar2 = (pNtk->vObjs).nSize;
      } while( true );
    }
    Prs_BoxSignals(pNtk,iVar9);
    iVar2 = Prs_BoxNtk(pNtk,iVar9);
    iVar3 = Prs_BoxIONum(pNtk,iVar9);
    if (iVar3 < 1) {
      __assert_fail("Prs_BoxIONum(pNtk, i) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                    ,0x1f6,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
    }
    if ((Prs_BoxSignals::V.nSize & 1U) != 0) {
      __assert_fail("Vec_IntSize(vBox) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                    ,0x1f7,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
    }
    if (iVar2 == -1) {
      iVar3 = Cba_ObjAlloc(p,CBA_BOX_DFFRS,4,1);
      iVar2 = Vec_IntEntry(&Prs_BoxSignals::V,3);
      iVar4 = Cba_ObjFon0(p,iVar3);
      Cba_NtkSetMap(p,iVar2,iVar4);
      iVar2 = Vec_IntEntry(&pNtk->vObjs,iVar9);
      iVar2 = Vec_IntEntry(&pNtk->vBoxes,iVar2 + 2);
      iVar2 = iVar2 + 1;
LAB_003532f2:
      Cba_ObjSetFunc(p,iVar3,iVar2);
    }
    else {
      iVar3 = Prs_BoxIsNode(pNtk,iVar9);
      if (iVar3 != 0) {
        iVar3 = Prs_BoxIONum(pNtk,iVar9);
        iVar3 = Cba_ObjAlloc(p,CBA_BOX_NODE,iVar3 + -1,1);
        iVar4 = Cba_ObjFon0(p,iVar3);
        iVar5 = Vec_IntEntryLast(&Prs_BoxSignals::V);
        Cba_FonSetName(p,iVar4,iVar5);
        iVar4 = Vec_IntEntryLast(&Prs_BoxSignals::V);
        iVar5 = Cba_ObjFon0(p,iVar3);
        Cba_NtkSetMap(p,iVar4,iVar5);
        goto LAB_003532f2;
      }
      pCVar1 = p->pDesign;
      pStr = Prs_NtkStr(pNtk,iVar2);
      iVar2 = Abc_NamStrFind(pCVar1->pMods,pStr);
      pCVar8 = Cba_ManNtk(pCVar1,iVar2);
      iVar2 = Cba_ObjAlloc(p,CBA_OBJ_BOX,(pCVar8->vInputs).nSize,(pCVar8->vOutputs).nSize);
      Cba_ObjSetFunc(p,iVar2,pCVar8->Id);
      Cba_NtkCleanMap2(p);
      iVar3 = 0;
      while (iVar3 < (pCVar8->vOutputs).nSize) {
        iVar4 = Vec_IntEntry(&pCVar8->vOutputs,iVar3);
        iVar4 = Cba_ObjName(pCVar8,iVar4);
        iVar3 = iVar3 + 1;
        Cba_NtkSetMap2(p,iVar4,iVar3);
      }
      for (iVar3 = 1; iVar3 < Prs_BoxSignals::V.nSize; iVar3 = iVar3 + 2) {
        iVar4 = Vec_IntEntry(&Prs_BoxSignals::V,iVar3 + -1);
        iVar5 = Vec_IntEntry(&Prs_BoxSignals::V,iVar3);
        iVar6 = Cba_NtkGetMap2(p,iVar4);
        if (iVar6 != 0) {
          iVar4 = Cba_NtkGetMap2(p,iVar4);
          if (iVar2 < 1) {
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xea,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
          }
          iVar6 = Cba_ObjFon0(p,iVar2);
          iVar4 = iVar4 + iVar6 + -1;
          Cba_FonSetName(p,iVar4,iVar5);
          Cba_NtkSetMap(p,iVar5,iVar4);
        }
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

int Prs_CreateBlifNtk( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    Vec_Int_t * vBox;
    int i, k, iObj, iTerm, iFon, FormId, ActId;
    // map inputs
    Cba_NtkCleanMap( p );
    Cba_NtkForEachPi( p, iObj, i )
        Cba_NtkSetMap( p, Cba_ObjName(p, iObj), Cba_ObjFon0(p, iObj) );
    // create objects
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        int FuncId = Prs_BoxNtk(pNtk, i);
        assert( Prs_BoxIONum(pNtk, i) > 0 );
        assert( Vec_IntSize(vBox) % 2 == 0 );
        if ( FuncId == -1 ) // latch
        {
            iObj = Cba_ObjAlloc( p, CBA_BOX_DFFRS, 4, 1 );
            Cba_NtkSetMap( p, Vec_IntEntry(vBox, 3), Cba_ObjFon0(p, iObj) ); // latch output
            Cba_ObjSetFunc( p, iObj, Prs_BoxName(pNtk, i)+1 ); // init + 1
        }
        else if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            iObj = Cba_ObjAlloc( p, CBA_BOX_NODE, Prs_BoxIONum(pNtk, i)-1, 1 );
            Cba_FonSetName( p, Cba_ObjFon0(p, iObj), Vec_IntEntryLast(vBox) ); // node output
            Cba_NtkSetMap( p, Vec_IntEntryLast(vBox), Cba_ObjFon0(p, iObj) );
            Cba_ObjSetFunc( p, iObj, FuncId );
        }
        else // box
        {
            Cba_Ntk_t * pBox = Cba_ManNtkFind( p->pDesign, Prs_NtkStr(pNtk, FuncId) );
            iObj = Cba_ObjAlloc( p, CBA_OBJ_BOX, Cba_NtkPiNum(pBox), Cba_NtkPoNum(pBox) );
            Cba_ObjSetFunc( p, iObj, Cba_NtkId(pBox) );
            // mark PO objects
            Cba_NtkCleanMap2( p );
            Cba_NtkForEachPo( pBox, iTerm, k )
                Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            // map box fons
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    iFon = Cba_ObjFon(p, iObj, Cba_NtkGetMap2(p, FormId)-1);
                    Cba_FonSetName( p, iFon, ActId );
                    Cba_NtkSetMap( p, ActId, iFon );
                }
        }
    }
    // connect objects
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        iObj = Cba_NtkPiNum(p) + Cba_NtkPoNum(p) + i + 1;
        if ( Prs_BoxNtk(pNtk, i) == -1 ) // latch
        {
            assert( Cba_ObjType(p, iObj) == CBA_BOX_DFFRS );
            iFon = Prs_CreateBlifFindFon( p, Vec_IntEntry(vBox, 1) ); // latch input
            if ( iFon )
                Cba_ObjSetFinFon( p, iObj, 0, iFon );
        }
        else if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            assert( Cba_ObjType(p, iObj) == CBA_BOX_NODE );
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
            {
                if ( k == 2 * Cba_ObjFinNum(p, iObj) ) // stop at node output
                    break;
                iFon = Prs_CreateBlifFindFon( p, ActId );
                if ( iFon )
                    Cba_ObjSetFinFon( p, iObj, k/2, iFon ); 
            }
        }
        else // box
        {
            // mark PI objects
            Cba_Ntk_t * pBox = Cba_ObjNtk(p, iObj);
            assert( Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj) );
            assert( Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj) );
            Cba_NtkCleanMap2( p );
            Cba_NtkForEachPi( pBox, iTerm, k )
                Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            // connect box fins
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    iFon = Prs_CreateBlifFindFon( p, ActId );
                    if ( iFon )
                        Cba_ObjSetFinFon( p, iObj, Cba_NtkGetMap2(p, FormId)-1, iFon );
                }
        }
    }
    // connect outputs
    Cba_NtkForEachPo( p, iObj, i )
    {
        iFon = Prs_CreateBlifFindFon( p, Cba_ObjName(p, iObj) );
        if ( iFon )
            Cba_ObjSetFinFon( p, iObj, 0, iFon );
    }
    return 0;
}